

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isBaseUnitImportedTwice_Test::TestBody(Units_isBaseUnitImportedTwice_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  byte bVar4;
  AssertHelper local_c0 [8];
  Message local_b8 [8];
  char *local_b0 [4];
  AssertionResult gtest_ar_;
  UnitsPtr u_i1;
  ImportSourcePtr i2;
  ImportSourcePtr i1;
  UnitsPtr u_i0;
  UnitsPtr u_i2;
  ModelPtr m_i2;
  ModelPtr m_i1;
  
  libcellml::Model::create();
  peVar3 = m_i1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"m_i1",(allocator<char> *)&m_i2);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)local_b0);
  libcellml::Model::create();
  peVar3 = m_i2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"m_i2",(allocator<char> *)&u_i1);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)local_b0);
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  peVar1 = u_i0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"some_other_u",(allocator<char> *)&i2);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_b0);
  peVar1 = u_i1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"u_i1",(allocator<char> *)&i2);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"u_i2",(allocator<char> *)&i2);
  libcellml::NamedEntity::setName
            ((string *)u_i2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::__cxx11::string::~string((string *)local_b0);
  libcellml::Model::addUnits
            ((shared_ptr *)
             m_i1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             m_i2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportSource::create();
  peVar2 = i2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"I_am_a_url",(allocator<char> *)&i1);
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string((string *)local_b0);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             i2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (u_i1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"u_i2",(allocator<char> *)&i1);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (u_i1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)local_b0);
  libcellml::ImportSource::create();
  peVar2 = i1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"I_am_another_url",(allocator<char> *)&gtest_ar_);
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string((string *)local_b0);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             i1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (u_i0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"u_i1",(allocator<char> *)&gtest_ar_);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (u_i0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)local_b0);
  gtest_ar_.success_ = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_b0,&gtest_ar_.success_,"u_i0->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8fe,local_b0[0]);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_b0,&gtest_ar_.success_,"u_i1->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8ff,local_b0[0]);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar4 = libcellml::ImportedEntity::isImport();
  gtest_ar_.success_ = (bool)(bVar4 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar4 != 0) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_b0,&gtest_ar_.success_,"u_i2->isImport()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x900,local_b0[0]);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)libcellml::Units::isBaseUnit();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_b0,&gtest_ar_.success_,"u_i0->isBaseUnit()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x901,local_b0[0]);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u_i0.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u_i2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u_i1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m_i2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m_i1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, isBaseUnitImportedTwice)
{
    libcellml::ModelPtr m_i1 = libcellml::Model::create();
    m_i1->setName("m_i1");
    libcellml::ModelPtr m_i2 = libcellml::Model::create();
    m_i2->setName("m_i2");

    libcellml::UnitsPtr u_i1 = libcellml::Units::create();
    libcellml::UnitsPtr u_i2 = libcellml::Units::create();
    libcellml::UnitsPtr u_i0 = libcellml::Units::create();

    u_i0->setName("some_other_u");
    u_i1->setName("u_i1");
    u_i2->setName("u_i2");

    m_i1->addUnits(u_i1);
    m_i2->addUnits(u_i2);

    libcellml::ImportSourcePtr i2 = libcellml::ImportSource::create();
    i2->setUrl("I_am_a_url");
    i2->setModel(m_i2);
    u_i1->setImportSource(i2);
    u_i1->setImportReference("u_i2");

    libcellml::ImportSourcePtr i1 = libcellml::ImportSource::create();
    i1->setUrl("I_am_another_url");
    i1->setModel(m_i1);
    u_i0->setImportSource(i1);
    u_i0->setImportReference("u_i1");

    EXPECT_TRUE(u_i0->isImport());
    EXPECT_TRUE(u_i1->isImport());
    EXPECT_FALSE(u_i2->isImport());
    EXPECT_TRUE(u_i0->isBaseUnit());
}